

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O0

vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_> *
libcellml::multiRootXml
          (vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
           *__return_storage_ptr__,string *content)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined1 local_130 [8];
  XmlDocPtr originalContentDoc;
  undefined1 local_110 [8];
  XmlDocPtr childDoc;
  string childContent;
  XmlNodePtr child;
  XmlNodePtr rootNode;
  XmlDocPtr doc;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> wrappedContent;
  string *content_local;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  *childDocs;
  
  wrappedContent.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>::
  vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_a0,(string *)content);
  trimCopy(&local_80,&local_a0);
  std::operator+(&local_60,"<root>",&local_80);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"</root>");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::make_shared<libcellml::XmlDoc>();
  peVar2 = std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&rootNode.
                          super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  XmlDoc::parse(peVar2,(string *)local_40);
  std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &rootNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  XmlDoc::rootNode((XmlDoc *)
                   &child.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)
                          &child.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(nullptr_t)0x0);
  if (bVar1) {
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &child.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    XmlNode::firstChild((XmlNode *)((long)&childContent.field_2 + 8));
    while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)
                                   ((long)&childContent.field_2 + 8),(nullptr_t)0x0), bVar1) {
      peVar3 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(childContent.field_2._M_local_buf + 8));
      bVar1 = XmlNode::isElement(peVar3);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(childContent.field_2._M_local_buf + 8));
        XmlNode::convertToString_abi_cxx11_
                  ((string *)
                   &childDoc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar3);
        std::make_shared<libcellml::XmlDoc>();
        peVar2 = std::
                 __shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_110);
        XmlDoc::parse(peVar2,(string *)
                             &childDoc.
                              super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        std::
        vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_110);
        std::shared_ptr<libcellml::XmlDoc>::~shared_ptr((shared_ptr<libcellml::XmlDoc> *)local_110);
        std::__cxx11::string::~string
                  ((string *)
                   &childDoc.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)(childContent.field_2._M_local_buf + 8));
      XmlNode::next((XmlNode *)
                    &originalContentDoc.
                     super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<libcellml::XmlNode>::operator=
                ((shared_ptr<libcellml::XmlNode> *)((long)&childContent.field_2 + 8),
                 (shared_ptr<libcellml::XmlNode> *)
                 &originalContentDoc.
                  super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr
                ((shared_ptr<libcellml::XmlNode> *)
                 &originalContentDoc.
                  super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr
              ((shared_ptr<libcellml::XmlNode> *)((long)&childContent.field_2 + 8));
  }
  else {
    std::make_shared<libcellml::XmlDoc>();
    peVar2 = std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_130);
    XmlDoc::parse(peVar2,content);
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_130);
    std::shared_ptr<libcellml::XmlDoc>::~shared_ptr((shared_ptr<libcellml::XmlDoc> *)local_130);
  }
  wrappedContent.field_2._M_local_buf[0xf] = '\x01';
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)
             &child.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::XmlDoc>::~shared_ptr
            ((shared_ptr<libcellml::XmlDoc> *)
             &rootNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_40);
  if ((wrappedContent.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XmlDocPtr> multiRootXml(const std::string &content)
{
    std::vector<XmlDocPtr> childDocs;

    // Wrap potentially multiple nodes in our own root node.
    auto wrappedContent = "<root>" + trimCopy(content) + "</root>";

    // Parse this new string as a document and turn the child nodes
    // into their own document.
    XmlDocPtr doc = std::make_shared<XmlDoc>();
    doc->parse(wrappedContent);
    XmlNodePtr rootNode = doc->rootNode();
    if (rootNode != nullptr) {
        XmlNodePtr child = rootNode->firstChild();
        while (child != nullptr) {
            if (child->isElement()) {
                auto childContent = child->convertToString();
                XmlDocPtr childDoc = std::make_shared<XmlDoc>();
                childDoc->parse(childContent);
                childDocs.push_back(childDoc);
            }
            child = child->next();
        }
    } else {
        XmlDocPtr originalContentDoc = std::make_shared<XmlDoc>();
        originalContentDoc->parse(content);
        childDocs.push_back(originalContentDoc);
    }

    return childDocs;
}